

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boost_unordered.hpp
# Opt level: O0

locator * __thiscall
boost::unordered::detail::foa::
table_core<boost::unordered::detail::foa::flat_set_types<slang::ast::Type_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::Type_const*,void>,std::equal_to<slang::ast::Type_const*>,std::allocator<slang::ast::Type_const*>>
::unchecked_emplace_with_rehash<slang::ast::Type_const*const&>
          (table_core<boost::unordered::detail::foa::flat_set_types<const_slang::ast::Type_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::ast::Type_*,_void>,_std::equal_to<const_slang::ast::Type_*>,_std::allocator<const_slang::ast::Type_*>_>
           *this,size_t hash,Type **args)

{
  arrays_type *in_RCX;
  table_core<boost::unordered::detail::foa::flat_set_types<const_slang::ast::Type_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::ast::Type_*,_void>,_std::equal_to<const_slang::ast::Type_*>,_std::allocator<const_slang::ast::Type_*>_>
  *in_RDX;
  long in_RSI;
  table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_const_slang::ast::Type_*>
  *in_RDI;
  locator *it;
  arrays_type new_arrays_;
  arrays_type *in_stack_ffffffffffffff78;
  table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_const_slang::ast::Type_*>
  *hash_00;
  table_core<boost::unordered::detail::foa::flat_set_types<const_slang::ast::Type_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::ast::Type_*,_void>,_std::equal_to<const_slang::ast::Type_*>,_std::allocator<const_slang::ast::Type_*>_>
  *in_stack_ffffffffffffffa0;
  group15<boost::unordered::detail::foa::plain_integral> *local_50;
  undefined8 local_48;
  Type **in_stack_ffffffffffffffc0;
  size_t in_stack_ffffffffffffffc8;
  size_t in_stack_ffffffffffffffd0;
  arrays_type *in_stack_ffffffffffffffd8;
  table_core<boost::unordered::detail::foa::flat_set_types<const_slang::ast::Type_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::ast::Type_*,_void>,_std::equal_to<const_slang::ast::Type_*>,_std::allocator<const_slang::ast::Type_*>_>
  *in_stack_ffffffffffffffe0;
  
  hash_00 = in_RDI;
  table_core<boost::unordered::detail::foa::flat_set_types<const_slang::ast::Type_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::ast::Type_*,_void>,_std::equal_to<const_slang::ast::Type_*>,_std::allocator<const_slang::ast::Type_*>_>
  ::new_arrays_for_growth(in_stack_ffffffffffffffa0);
  table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_const_slang::ast::Type_*>
  ::table_locator(in_RDI);
  table_core<boost::unordered::detail::foa::flat_set_types<const_slang::ast::Type_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::ast::Type_*,_void>,_std::equal_to<const_slang::ast::Type_*>,_std::allocator<const_slang::ast::Type_*>_>
  ::position_for((size_t)hash_00,in_stack_ffffffffffffff78);
  nosize_unchecked_emplace_at<slang::ast::Type_const*const&>
            (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0,
             in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
  in_RDI->pg = local_50;
  *(undefined8 *)&in_RDI->n = local_48;
  in_RDI->p = in_stack_ffffffffffffffc0;
  table_core<boost::unordered::detail::foa::flat_set_types<const_slang::ast::Type_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::ast::Type_*,_void>,_std::equal_to<const_slang::ast::Type_*>,_std::allocator<const_slang::ast::Type_*>_>
  ::unchecked_rehash(in_RDX,in_RCX);
  *(long *)(in_RSI + 0x28) = *(long *)(in_RSI + 0x28) + 1;
  return hash_00;
}

Assistant:

BOOST_NOINLINE locator unchecked_emplace_with_rehash(std::size_t hash, Args&&... args) {
        auto new_arrays_ = new_arrays_for_growth();
        locator it;
        BOOST_TRY {
            /* strong exception guarantee -> try insertion before rehash */
            it = nosize_unchecked_emplace_at(new_arrays_, position_for(hash, new_arrays_), hash,
                                             std::forward<Args>(args)...);
        }